

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall ImgfsFile::FileEntry::FileEntry(FileEntry *this,string *name)

{
  pointer pcVar1;
  
  (this->super_DirEntry)._ofs = 0;
  (this->super_DirEntry)._magic = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._indexsize = 0;
  (this->super_DirEntry)._size = 0;
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__FileEntry_001472e8;
  (this->_name)._name._M_dataplus._M_p = (pointer)&(this->_name)._name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_name)._name,pcVar1,pcVar1 + name->_M_string_length);
  (this->_name)._ptr = 0;
  (this->_name)._length = 0;
  (this->_name)._flags = 0;
  (this->_name)._hash = 0;
  (this->super_DirEntry)._magic = 0xfffff6fe;
  this->_sectionlist = 0;
  this->_attr = 0x41;
  this->_filetime = 0;
  this->_reserved = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._indexsize = 0;
  *(undefined8 *)&(this->super_DirEntry)._size = 0;
  return;
}

Assistant:

explicit FileEntry(const std::string& name)
            : _name(name)
        {
            _magic= MAGIC;
            _datatable=0;
            _sectionlist=0;
            _size=0;
            _attr= 0x41;
            _filetime= 0;
            _reserved= 0;
            _indexptr=0;
            _indexsize=0;
        }